

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

void __thiscall
Js::CompoundString::CopyVirtual
          (CompoundString *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos,
          byte recursionDepth)

{
  code *pcVar1;
  StringCopyInfo copyInfo;
  bool bVar2;
  charcount_t cVar3;
  CharCount CVar4;
  int iVar5;
  CharCount CVar6;
  uint uVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  JavascriptString *pJVar10;
  undefined7 in_register_00000009;
  uint uVar11;
  Block *pBVar12;
  size_t sizeInWords;
  Type TVar13;
  Block *pBVar14;
  ulong uVar15;
  Block *pBVar16;
  StringCopyInfo local_a8;
  char16 *local_90;
  ulong local_88;
  StringCopyInfoStack *local_80;
  CompoundString *local_78;
  int local_70;
  Type local_6c;
  undefined8 local_68;
  Block *local_60;
  uint local_54;
  Block *local_50;
  char16 *local_48;
  JavascriptString *local_40;
  ulong local_38;
  
  local_68 = CONCAT71(in_register_00000009,recursionDepth);
  local_80 = nestedStringTreeCopyInfos;
  local_48 = buffer;
  pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar8 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x41e,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) goto LAB_00b3a64a;
    *puVar9 = 0;
  }
  if (local_48 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x41f,"(buffer)","buffer");
    if (!bVar2) goto LAB_00b3a64a;
    *puVar9 = 0;
  }
  cVar3 = JavascriptString::GetLength((JavascriptString *)this);
  if (cVar3 == 0) {
    return;
  }
  if (cVar3 == 1) {
    if (this->directCharLength != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x428,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
      if (!bVar2) goto LAB_00b3a64a;
      *puVar9 = 0;
    }
    if ((this->lastBlockInfo).charLength != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x429,"(LastBlockCharLength() == 1)","LastBlockCharLength() == 1"
                                 );
      if (!bVar2) goto LAB_00b3a64a;
      *puVar9 = 0;
    }
    *local_48 = *(this->lastBlockInfo).buffer.ptr;
    return;
  }
  local_6c = this->directCharLength;
  TVar13 = local_6c;
  if (local_6c == 0xffffffff) {
    TVar13 = cVar3;
  }
  local_60 = (this->lastBlock).ptr;
  pBVar12 = (Block *)(this->lastBlockInfo).buffer.ptr;
  local_78 = this;
  CVar4 = Block::PointerLengthFromCharLength((this->lastBlockInfo).charLength);
  pJVar10 = (JavascriptString *)(ulong)CVar4;
  pBVar14 = local_60;
  local_54 = TVar13;
  local_38 = (ulong)cVar3;
  if (TVar13 < cVar3) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_70 = (int)local_68 + 1;
    pBVar14 = local_60;
    do {
      CVar4 = (CharCount)pJVar10;
      if (CVar4 == 0) {
        do {
          if (pBVar14 == (Block *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x43b,"(block)","block");
            if (!bVar2) goto LAB_00b3a64a;
            *puVar9 = 0;
          }
          pBVar14 = (pBVar14->previous).ptr;
          if (pBVar14 == (Block *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x43d,"(block)","block");
            if (!bVar2) goto LAB_00b3a64a;
            *puVar9 = 0;
          }
          pBVar12 = (pBVar14->bufferOwner).ptr;
          CVar4 = Block::PointerLengthFromCharLength(pBVar14->charLength);
        } while (CVar4 == 0);
        pBVar12 = pBVar12 + 1;
      }
      pJVar10 = (JavascriptString *)(ulong)(CVar4 - 1);
      local_50 = (&pBVar12->bufferOwner)[(long)pJVar10].ptr;
      if (local_50 == (Block *)0x0) {
        AssertCount = AssertCount + 1;
        local_40 = pJVar10;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x2f2,"(pointer)","pointer");
        if (!bVar2) goto LAB_00b3a64a;
        *puVar9 = 0;
        pJVar10 = local_40;
      }
      if (((ulong)local_50 & 1) == 0) {
        local_40 = pJVar10;
        pJVar10 = VarTo<Js::JavascriptString>(local_50);
        cVar3 = JavascriptString::GetLength(pJVar10);
        uVar15 = (ulong)((uint)local_38 - cVar3);
        if ((uint)local_38 < cVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x465,"(remainingCharLengthToCopy >= copyCharLength)",
                                      "remainingCharLengthToCopy >= copyCharLength");
          if (!bVar2) goto LAB_00b3a64a;
          *puVar9 = 0;
        }
        if (((byte)local_68 == '\x03') &&
           (iVar5 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6a])(pJVar10),
           (char)iVar5 != '\0')) {
          StringCopyInfo::StringCopyInfo(&local_a8,pJVar10,local_48 + uVar15);
          copyInfo.destinationBuffer = local_a8.destinationBuffer;
          copyInfo.sourceString = local_a8.sourceString;
          copyInfo.isInitialized = local_a8.isInitialized;
          copyInfo._17_7_ = local_a8._17_7_;
          StringCopyInfoStack::Push(local_80,copyInfo);
          pJVar10 = local_40;
        }
        else {
          if (3 < (byte)local_68) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x470,"(recursionDepth <= MaxCopyRecursionDepth)",
                                        "recursionDepth <= MaxCopyRecursionDepth");
            if (!bVar2) goto LAB_00b3a64a;
            *puVar9 = 0;
          }
          JavascriptString::Copy(pJVar10,local_48 + uVar15,local_80,(byte)local_70);
          pJVar10 = local_40;
        }
      }
      else {
        if ((int)pJVar10 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x445,"(pointerIndex != 0)","pointerIndex != 0");
          if (!bVar2) goto LAB_00b3a64a;
          *puVar9 = 0;
        }
        pBVar16 = (&pBVar12->bufferOwner)[(long)(ulong)(CVar4 - 2)].ptr;
        if (pBVar16 == (Block *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x2f2,"(pointer)","pointer");
          if (!bVar2) goto LAB_00b3a64a;
          *puVar9 = 0;
        }
        if (((ulong)pBVar16 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x449,"(!IsPackedInfo(pointer2))","!IsPackedInfo(pointer2)");
          if (!bVar2) goto LAB_00b3a64a;
          *puVar9 = 0;
        }
        pJVar10 = VarTo<Js::JavascriptString>(pBVar16);
        if (local_50 == (Block *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x2fd,"(pointer)","pointer");
          if (!bVar2) goto LAB_00b3a64a;
          *puVar9 = 0;
        }
        pBVar16 = local_50;
        uVar15 = (ulong)local_50 >> 0x20;
        local_40 = pJVar10;
        cVar3 = JavascriptString::GetLength(pJVar10);
        local_88 = uVar15;
        if (cVar3 < (uint)((ulong)pBVar16 >> 0x20)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x459,"(startIndex <= s->GetLength())",
                                      "startIndex <= s->GetLength()");
          if (!bVar2) goto LAB_00b3a64a;
          *puVar9 = 0;
        }
        pBVar16 = (Block *)((ulong)local_50 >> 1 & 0x7fffffff);
        cVar3 = JavascriptString::GetLength(local_40);
        uVar11 = (uint)pBVar16;
        if (cVar3 - (int)local_88 < uVar11) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x45a,"(copyCharLength <= s->GetLength() - startIndex)",
                                      "copyCharLength <= s->GetLength() - startIndex");
          if (!bVar2) goto LAB_00b3a64a;
          *puVar9 = 0;
        }
        uVar7 = (uint)local_38;
        local_38 = (ulong)(uVar7 - uVar11);
        local_50 = pBVar16;
        if (uVar7 < uVar11) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x45c,"(remainingCharLengthToCopy >= copyCharLength)",
                                      "remainingCharLengthToCopy >= copyCharLength");
          if (!bVar2) goto LAB_00b3a64a;
          *puVar9 = 0;
        }
        uVar15 = local_38;
        local_90 = local_48 + local_38;
        pcVar8 = JavascriptString::GetString(local_40);
        JavascriptString::CopyHelper(local_90,pcVar8 + local_88,(charcount_t)local_50);
        pJVar10 = (JavascriptString *)(ulong)(CVar4 - 2);
      }
      CVar4 = (CharCount)pJVar10;
      local_38 = uVar15;
    } while (local_54 < (uint)uVar15);
  }
  if ((uint)local_38 != local_54) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x476,"(remainingCharLengthToCopy == directCharLength)",
                                "remainingCharLengthToCopy == directCharLength");
    if (!bVar2) goto LAB_00b3a64a;
    *puVar9 = 0;
  }
  if ((uint)local_38 == 0) {
LAB_00b3a5b5:
    if (pBVar14 == (Block *)0x0) {
      return;
    }
    pBVar12 = (pBVar14->previous).ptr;
    if (pBVar12 == (Block *)0x0) {
      return;
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (pBVar12->charLength != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x4ba,"(block->CharLength() == 0)","block->CharLength() == 0");
        if (!bVar2) goto LAB_00b3a64a;
        *puVar9 = 0;
      }
      pBVar12 = (pBVar12->previous).ptr;
      if (pBVar12 == (Block *)0x0) {
        return;
      }
    } while( true );
  }
  if (CVar4 == 0) {
    if (pBVar14 == (Block *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x47f,"(block)","block");
      if (!bVar2) goto LAB_00b3a64a;
      *puVar9 = 0;
    }
    pBVar14 = (pBVar14->previous).ptr;
    if (pBVar14 == (Block *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x481,"(block)","block");
      if (!bVar2) {
LAB_00b3a64a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar9 = 0;
    }
  }
  else {
    if (local_6c != 0xffffffff) {
      sizeInWords = local_38 & 0xffffffff;
      if (pBVar14 != (Block *)0x0) {
        pBVar12 = (pBVar14->previous).ptr;
        sizeInWords = local_38 & 0xffffffff;
        if (pBVar12 != (Block *)0x0) {
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          sizeInWords = local_38 & 0xffffffff;
          do {
            if ((uint)sizeInWords < pBVar12->charLength) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar9 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                          ,0x494,"(blockCharLength >= previousBlock->CharLength())",
                                          "blockCharLength >= previousBlock->CharLength()");
              if (!bVar2) goto LAB_00b3a64a;
              *puVar9 = 0;
            }
            sizeInWords = (size_t)((uint)sizeInWords - pBVar12->charLength);
            pBVar12 = (pBVar12->previous).ptr;
          } while (pBVar12 != (Block *)0x0);
        }
      }
      CVar6 = Block::PointerLengthFromCharLength((CharCount)sizeInWords);
      if (CVar6 != CVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x498,
                                    "(Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex)"
                                    ,
                                    "Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex"
                                   );
        if (!bVar2) goto LAB_00b3a64a;
        *puVar9 = 0;
      }
      goto LAB_00b3a470;
    }
    if (pBVar14 == local_60) {
      sizeInWords = (size_t)(local_78->lastBlockInfo).charLength;
      goto LAB_00b3a470;
    }
  }
  sizeInWords = (size_t)pBVar14->charLength;
LAB_00b3a470:
  if (pBVar14 == local_60) {
    pBVar12 = (Block *)(local_78->lastBlockInfo).buffer.ptr;
  }
  else {
    pBVar12 = (pBVar14->bufferOwner).ptr + 1;
  }
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    uVar11 = (uint)sizeInWords;
    if (uVar11 != 0) {
      uVar7 = (uint)local_38;
      local_38 = (ulong)(uVar7 - uVar11);
      if (uVar7 < uVar11) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x4a1,"(remainingCharLengthToCopy >= blockCharLength)",
                                    "remainingCharLengthToCopy >= blockCharLength");
        if (!bVar2) goto LAB_00b3a64a;
        *puVar9 = 0;
      }
      uVar15 = local_38;
      js_wmemcpy_s(local_48 + local_38,sizeInWords,(char16 *)pBVar12,sizeInWords);
      if ((int)uVar15 == 0) goto LAB_00b3a5b5;
    }
    if (pBVar14 == (Block *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x4a9,"(block)","block");
      if (!bVar2) goto LAB_00b3a64a;
      *puVar9 = 0;
    }
    pBVar14 = (pBVar14->previous).ptr;
    if (pBVar14 == (Block *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x4ab,"(block)","block");
      if (!bVar2) goto LAB_00b3a64a;
      *puVar9 = 0;
    }
    pBVar12 = (pBVar14->bufferOwner).ptr + 1;
    sizeInWords = (size_t)pBVar14->charLength;
  } while( true );
}

Assistant:

void CompoundString::CopyVirtual(
        _Out_writes_(m_charLength) char16 *const buffer,
        StringCopyInfoStack &nestedStringTreeCopyInfos,
        const byte recursionDepth)
    {
        Assert(!IsFinalized());
        Assert(buffer);

        const CharCount totalCharLength = GetLength();
        switch(totalCharLength)
        {
            case 0:
                return;

            case 1:
                Assert(HasOnlyDirectChars());
                Assert(LastBlockCharLength() == 1);

                buffer[0] = LastBlockChars()[0];
                return;
        }

        // Copy buffers from string pointers
        const bool hasOnlyDirectChars = HasOnlyDirectChars();
        const CharCount directCharLength = hasOnlyDirectChars ? totalCharLength : this->directCharLength;
        CharCount remainingCharLengthToCopy = totalCharLength;
        const Block *const lastBlock = this->lastBlock;
        const Block *block = lastBlock;
        Field(void*) const *blockPointers = LastBlockPointers();
        CharCount pointerIndex = LastBlockPointerLength();
        while(remainingCharLengthToCopy > directCharLength)
        {
            while(pointerIndex == 0)
            {
                Assert(block);
                block = block->Previous();
                Assert(block);
                blockPointers = (Field(void*) const *)block->Pointers();
                pointerIndex = block->PointerLength();
            }

            void *const pointer = blockPointers[--pointerIndex];
            if(IsPackedInfo(pointer))
            {
                Assert(pointerIndex != 0);
                void *pointer2 = blockPointers[--pointerIndex];
                JavascriptString *s;
    #if defined(TARGET_64)
                Assert(!IsPackedInfo(pointer2));
    #else
                if(IsPackedInfo(pointer2))
                {
                    Assert(pointerIndex != 0);
                    s = VarTo<JavascriptString>(blockPointers[--pointerIndex]);
                }
                else
    #endif
                {
                    s = VarTo<JavascriptString>(pointer2);
                    pointer2 = nullptr;
                }

                CharCount startIndex, copyCharLength;
                UnpackSubstringInfo(pointer, pointer2, &startIndex, &copyCharLength);
                Assert(startIndex <= s->GetLength());
                Assert(copyCharLength <= s->GetLength() - startIndex);

                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                CopyHelper(&buffer[remainingCharLengthToCopy], &s->GetString()[startIndex], copyCharLength);
            }
            else
            {
                JavascriptString *const s = VarTo<JavascriptString>(pointer);
                const CharCount copyCharLength = s->GetLength();

                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
                {
                    // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                    // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                    // the caller can deal with those after returning.
                    nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[remainingCharLengthToCopy]));
                }
                else
                {
                    Assert(recursionDepth <= MaxCopyRecursionDepth);
                    s->Copy(&buffer[remainingCharLengthToCopy], nestedStringTreeCopyInfos, recursionDepth + 1);
                }
            }
        }

        Assert(remainingCharLengthToCopy == directCharLength);
        if(remainingCharLengthToCopy != 0)
        {
            // Determine the number of direct chars in the current block
            CharCount blockCharLength;
            if(pointerIndex == 0)
            {
                // The string switched to pointer mode at the beginning of the current block, or the string never switched to
                // pointer mode and the last block is empty. In either case, direct chars span to the end of the previous block.
                Assert(block);
                block = block->Previous();
                Assert(block);
                blockCharLength = block->CharLength();
            }
            else if(hasOnlyDirectChars)
            {
                // The string never switched to pointer mode, so the current block's char length is where direct chars end
                blockCharLength = block == lastBlock ? LastBlockCharLength() : block->CharLength();
            }
            else
            {
                // The string switched to pointer mode somewhere in the middle of the current block. To determine where direct
                // chars end in this block, all previous blocks are scanned and their char lengths discounted.
                blockCharLength = remainingCharLengthToCopy;
                if(block)
                {
                    for(const Block *previousBlock = block->Previous();
                        previousBlock;
                        previousBlock = previousBlock->Previous())
                    {
                        Assert(blockCharLength >= previousBlock->CharLength());
                        blockCharLength -= previousBlock->CharLength();
                    }
                }
                Assert(Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex);
            }

            // Copy direct chars
            const char16 *blockChars = block == lastBlock ? LastBlockChars() : block->Chars();
            while(true)
            {
                if(blockCharLength != 0)
                {
                    Assert(remainingCharLengthToCopy >= blockCharLength);
                    remainingCharLengthToCopy -= blockCharLength;
                    // SWB: this is copying "direct chars" and there should be no pointers here. No write barrier needed.
                    js_wmemcpy_s(&buffer[remainingCharLengthToCopy], blockCharLength, blockChars, blockCharLength);
                    if(remainingCharLengthToCopy == 0)
                        break;
                }

                Assert(block);
                block = block->Previous();
                Assert(block);
                blockChars = block->Chars();
                blockCharLength = block->CharLength();
            }
        }

    #if DBG
        // Verify that all nonempty blocks have been visited
        if(block)
        {
            while(true)
            {
                block = block->Previous();
                if(!block)
                    break;
                Assert(block->CharLength() == 0);
            }
        }
    #endif

        Assert(remainingCharLengthToCopy == 0);
    }